

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O1

bool_t prf_object_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint16_t uVar1;
  int16_t iVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  uint len;
  uint uVar5;
  
  uVar1 = bf_get_uint16_be(bfile);
  node->opcode = uVar1;
  if (uVar1 == prf_object_info.opcode) {
    uVar1 = bf_get_uint16_be(bfile);
    node->length = uVar1;
    if (uVar1 < 0x1c) {
      prf_error(6,"object node of unsupported length (%d bytes short).");
    }
    else {
      if (node->data != (uint8_t *)0x0) {
LAB_00108e46:
        puVar4 = node->data;
        bf_read(bfile,puVar4,8);
        uVar3 = bf_get_uint32_be(bfile);
        *(uint32_t *)(puVar4 + 8) = uVar3;
        iVar2 = bf_get_int16_be(bfile);
        *(int16_t *)(puVar4 + 0xc) = iVar2;
        uVar1 = bf_get_uint16_be(bfile);
        *(uint16_t *)(puVar4 + 0xe) = uVar1;
        iVar2 = bf_get_int16_be(bfile);
        *(int16_t *)(puVar4 + 0x10) = iVar2;
        iVar2 = bf_get_int16_be(bfile);
        *(int16_t *)(puVar4 + 0x12) = iVar2;
        iVar2 = bf_get_int16_be(bfile);
        *(int16_t *)(puVar4 + 0x14) = iVar2;
        uVar5 = 0x1a;
        if (0x1b < node->length) {
          iVar2 = bf_get_int16_be(bfile);
          *(int16_t *)(puVar4 + 0x16) = iVar2;
          uVar5 = 0x1c;
        }
        len = node->length - uVar5;
        if (node->length < uVar5 || len == 0) {
          return 1;
        }
        bf_read(bfile,node->data + ((ulong)uVar5 - 4),len);
        return 1;
      }
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar4 = (uint8_t *)malloc((ulong)(uVar1 - 4));
      }
      else {
        puVar4 = (uint8_t *)pool_malloc(pool_id,uVar1 - 4);
      }
      node->data = puVar4;
      if (puVar4 != (uint8_t *)0x0) goto LAB_00108e46;
      prf_error(9,"memory allocation problem (returned NULL)");
    }
    uVar5 = 4;
  }
  else {
    prf_error(9,"tried object load method on node of type %d.",(ulong)uVar1);
    uVar5 = 2;
  }
  bf_rewind(bfile,uVar5);
  return 0;
}

Assistant:

static
bool_t
prf_object_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_object_info.opcode ) {
        prf_error( 9, "tried object load method on node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );
    if ( node->length < NODE_DATA_SIZE + 4 ) {
        prf_error( 6, "object node of unsupported length (%d bytes short).",
            node->length );
        bf_rewind( bfile, 4 );
        return FALSE;
    }

    if ( node->length > 4 && node->data == NULL ) { /* not preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        bf_read( bfile, (uint8_t *) data->ascii_id, 8 ); pos += 8;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;
        data->relative_priority = bf_get_int16_be( bfile ); pos += 2;
        data->transparency = bf_get_uint16_be( bfile ); pos += 2;
        data->special_effect_id1 = bf_get_int16_be( bfile ); pos += 2;
        data->special_effect_id2 = bf_get_int16_be( bfile ); pos += 2;
        data->significance = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->spare = bf_get_int16_be( bfile ); pos += 2;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}